

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src)

{
  Entry **__return_storage_ptr__;
  cmCompiledGeneratorExpression *this_00;
  TargetPropertyEntry *this_01;
  auto_ptr<cmCompiledGeneratorExpression> local_90;
  TargetPropertyEntry *local_88;
  auto_ptr_ref<cmCompiledGeneratorExpression> local_78;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_58 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  string *src_local;
  cmGeneratorTarget *this_local;
  
  __return_storage_ptr__ = &ge.Backtrace.Cur;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)__return_storage_ptr__,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_58,(cmListFileBacktrace *)__return_storage_ptr__);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff80,(string *)local_58)
  ;
  local_78 = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&stack0xffffffffffffff80);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff90,local_78);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff80);
  this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                      ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff90);
  cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this_00,true);
  this_01 = (TargetPropertyEntry *)operator_new(0x10);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_90,(auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff90);
  TargetPropertyEntry::TargetPropertyEntry(this_01,&local_90,&TargetPropertyEntry::NoLinkImplItem);
  local_88 = this_01;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  ::push_back(&this->SourceEntries,&local_88);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
  ::clear(&this->KindedSourcesMap);
  this->LinkImplementationLanguageIsContextDependent = true;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&stack0xffffffffffffff90);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_58);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&ge.Backtrace.Cur);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(new TargetPropertyEntry(cge));
  this->KindedSourcesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}